

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::WriteBricks(brick_pool *Bp,cstr FileName)

{
  long lVar1;
  undefined4 uVar2;
  FILE *__s;
  idx2_file *piVar3;
  undefined4 uVar4;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar5;
  brick_volume BrickVol;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_98;
  int local_8c;
  grid local_88;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_70;
  int local_68;
  u64 local_48;
  u64 uStack_40;
  
  __s = fopen(FileName,"wb");
  if (__s == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xd3;
    uVar4 = 10;
  }
  else {
    local_70 = (Bp->Idx2->Dims3).field_0.field_3.XY.field_0;
    local_68 = (Bp->Idx2->Dims3).field_0.field_0.Z;
    fwrite(&local_70,0xc,1,__s);
    local_70 = (Bp->Idx2->BrickDims3).field_0.field_3.XY.field_0;
    local_68 = (Bp->Idx2->BrickDims3).field_0.field_0.Z;
    fwrite(&local_70,0xc,1,__s);
    local_70 = (Bp->Idx2->NBricks3).Arr[0].field_0.field_3.XY.field_0;
    local_68 = (Bp->Idx2->NBricks3).Arr[0].field_0.field_0.Z;
    fwrite(&local_70,0xc,1,__s);
    local_98.field_0.Z = 0;
    piVar3 = Bp->Idx2;
    if ((piVar3->NBricks3).Arr[0].field_0.field_0.Z < 1) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe5;
    }
    else {
      do {
        uVar4 = local_98.field_0.Z;
        local_98.field_0.Y = 0;
        if (0 < (piVar3->NBricks3).Arr[0].field_0.field_0.Y) {
          do {
            local_98.field_0.X = 0;
            local_8c = local_98.field_0.Y;
            if (0 < (piVar3->NBricks3).Arr[0].field_0.field_0.X) {
              do {
                uVar2 = local_98.field_0.X;
                local_70.field_0.Y = local_98.field_0.Y;
                local_70.field_0.X = local_98.field_0.X;
                local_68 = uVar4;
                fwrite(&local_70,0xc,1,__s);
                GetBrickVolume((brick_volume *)&local_70.field_0,Bp,(v3i *)&local_98.field_0);
                local_88.super_extent.From =
                     (long)(uStack_40 << 0x16) >> 0xb & 0xffffffff00000000U |
                     (ulong)(uint)((long)(uStack_40 << 0x2b) >> 0x2b);
                local_88.super_extent.Dims =
                     CONCAT44(local_88.super_extent.Dims._4_4_,(int)((long)(uStack_40 * 2) >> 0x2b))
                ;
                fwrite(&local_88,0xc,1,__s);
                local_88.super_extent.From = local_48;
                local_88.super_extent.Dims = uStack_40;
                local_88.Strd = 0x40000200001;
                WriteVolume((FILE *)__s,(volume *)&local_70.field_0,&local_88);
                local_98.field_0.X = uVar2 + 1;
                piVar3 = Bp->Idx2;
              } while (local_98.field_0.X < (piVar3->NBricks3).Arr[0].field_0.field_0.X);
            }
            local_98.field_0.Y = local_8c + 1;
          } while (local_98.field_0.Y < (piVar3->NBricks3).Arr[0].field_0.field_0.Y);
        }
        local_98.field_0.Z = uVar4 + 1;
      } while (local_98.field_0.Z < (piVar3->NBricks3).Arr[0].field_0.field_0.Z);
      lVar1 = *in_FS_OFFSET;
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2SparseBricks.cpp"
      ;
      *(undefined4 *)(lVar1 + -0x980) = 0xe5;
      if (__s == (FILE *)0x0) {
        uVar4 = 0;
        goto LAB_0019b64a;
      }
    }
    fclose(__s);
    uVar4 = 0;
  }
LAB_0019b64a:
  eVar5.Code = (char)uVar4;
  eVar5.StackIdx = (char)((uint)uVar4 >> 8);
  eVar5.StrGened = (bool)(char)((uint)uVar4 >> 0x10);
  eVar5._11_1_ = (char)((uint)uVar4 >> 0x18);
  eVar5.Msg = "";
  eVar5._12_4_ = 0;
  return eVar5;
}

Assistant:

error<idx2_err_code>
WriteBricks(brick_pool* Bp, cstr FileName)
{
  idx2_RAII(FILE*, Fp = fopen(FileName, "wb"), , if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(idx2_err_code::FileCreateFailed);

  WritePOD(Fp, Bp->Idx2->Dims3);
  WritePOD(Fp, Bp->Idx2->BrickDims3);
  WritePOD(Fp, Bp->Idx2->NBricks3[0]);

  v3i B3;
  idx2_BeginFor3 (B3, v3i(0), Bp->Idx2->NBricks3[0], v3i(1))
  {
    //u64 BrickIndex = GetLinearBrick(*Bp->Idx2, 0, B3);
    WritePOD(Fp, B3);
    brick_volume BrickVol = GetBrickVolume(Bp, B3);
    v3i D3 = Dims(BrickVol.ExtentLocal);
    WritePOD(Fp, Dims(BrickVol.ExtentLocal));
    v3i F3 = From(BrickVol.ExtentLocal);
    WriteVolume(Fp, BrickVol.Vol, grid(BrickVol.ExtentLocal));
  } idx2_EndFor3

  return idx2_Error(idx2_err_code::NoError);
}